

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O1

void RDL_findIndegree(uint a,uint b,uint *indegree,RDL_sPathInfo *spi)

{
  uint b_00;
  RDL_graph *pRVar1;
  ulong uVar2;
  
  indegree[b] = 0;
  if (a != b) {
    pRVar1 = spi->dPaths[a];
    if (pRVar1->degree[b] != 0) {
      uVar2 = 0;
      do {
        b_00 = pRVar1->adjList[b][uVar2][0];
        if (indegree[b_00] == 0xffffffff) {
          RDL_findIndegree(a,b_00,indegree,spi);
        }
        indegree[b_00] = indegree[b_00] + 1;
        uVar2 = uVar2 + 1;
        pRVar1 = spi->dPaths[a];
      } while (uVar2 < pRVar1->degree[b]);
    }
  }
  return;
}

Assistant:

static void RDL_findIndegree(unsigned a, unsigned b,
    unsigned *indegree, const RDL_sPathInfo *spi)
{
/* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  indegree[b] = 0;

  if(a==b)
  {
    return;
  }
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (indegree[vertex] == UINT_MAX) {
      RDL_findIndegree(a, vertex, indegree, spi);
    }
    indegree[vertex] += 1;
  }
}